

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

idx_t duckdb::ZSTDStorage::StringFinalAnalyze(AnalyzeState *state_p)

{
  BlockManager *pBVar1;
  _func_int **pp_Var2;
  ulong uVar3;
  long lVar4;
  idx_t iVar5;
  ZSTDAnalyzeState *state;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  
  pBVar1 = state_p[2].info.block_manager;
  iVar5 = 0xffffffffffffffff;
  if (pBVar1 != (BlockManager *)0x0) {
    if (state_p[4].info.block_manager != (BlockManager *)0x0) {
      state_p[3].info.block_manager =
           (BlockManager *)((long)&(state_p[3].info.block_manager)->_vptr_BlockManager + 1);
    }
    pp_Var2 = state_p[2]._vptr_AnalyzeState;
    if (state_p[1]._vptr_AnalyzeState[0x4e] <= (_func_int *)((ulong)pp_Var2 / (ulong)pBVar1)) {
      auVar6._8_4_ = (int)((ulong)pp_Var2 >> 0x20);
      auVar6._0_8_ = pp_Var2;
      auVar6._12_4_ = 0x45300000;
      dVar7 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)pp_Var2) - 4503599627370496.0)) * 0.5;
      uVar3 = (ulong)dVar7;
      lVar4 = (((ulong)pBVar1 >> 0xb) + 1) - (ulong)(((ulong)pBVar1 & 0x7ff) == 0);
      lVar4 = (long)pBVar1 * 4 + lVar4 * 8 + (lVar4 * 0x14 + 7U & 0xffffffffffffff8) +
              ((long)(dVar7 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3);
      auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar8._0_8_ = lVar4;
      auVar8._12_4_ = 0x45300000;
      dVar7 = (auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0);
      uVar3 = (ulong)dVar7;
      iVar5 = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
    }
  }
  return iVar5;
}

Assistant:

idx_t ZSTDStorage::StringFinalAnalyze(AnalyzeState &state_p) {
	auto &state = state_p.Cast<ZSTDAnalyzeState>();

	if (!state.count) {
		return NumericLimits<idx_t>::Maximum();
	}

	if (state.values_in_vector) {
		D_ASSERT(state.values_in_vector < ZSTD_VECTOR_SIZE);
		state.segment_count++;
	}

	double penalty;
	idx_t average_length = state.total_size / state.count;
	auto threshold = state.config.options.zstd_min_string_length;
	if (average_length >= threshold) {
		penalty = 1.0;
	} else {
		// Inbetween these two points you're better off using uncompressed or a different compression algorithm.
		return NumericLimits<idx_t>::Maximum();
	}

	auto expected_compressed_size = (double)state.total_size / 2.0;

	idx_t estimated_size = 0;
	estimated_size += LossyNumericCast<idx_t>(expected_compressed_size);

	estimated_size += state.count * sizeof(string_length_t);
	estimated_size += GetVectorMetadataSize(GetVectorCount(state.count));

	return LossyNumericCast<idx_t>((double)estimated_size * penalty);
}